

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwritedeclaration.cpp
# Opt level: O1

void __thiscall CPP::WriteDeclaration::acceptLayout(WriteDeclaration *this,DomLayout *node)

{
  QTextStream *pQVar1;
  long in_FS_OFFSET;
  QString local_60;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = L"QLayout";
  local_48.d.size = 7;
  if (node->m_has_attr_class == true) {
    local_48.d.d = (node->m_attr_class).d.d;
    local_48.d.ptr = (node->m_attr_class).d.ptr;
    local_48.d.size = (node->m_attr_class).d.size;
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_48.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_48.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  pQVar1 = (QTextStream *)QTextStream::operator<<(this->m_output,&this->m_option->indent);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,&local_48);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1," *");
  Driver::findOrInsertLayout(&local_60,this->m_driver,node);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,&local_60);
  QTextStream::operator<<(pQVar1,";\n");
  if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
    }
  }
  TreeWalker::acceptLayout(&this->super_TreeWalker,node);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteDeclaration::acceptLayout(DomLayout *node)
{
    QString className = u"QLayout"_s;
    if (node->hasAttributeClass())
        className = node->attributeClass();

    m_output << m_option.indent << className << " *" << m_driver->findOrInsertLayout(node) << ";\n";

    TreeWalker::acceptLayout(node);
}